

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O0

void __thiscall
OptionRecordString::OptionRecordString
          (OptionRecordString *this,string *Xname,string *Xdescription,bool Xadvanced,
          string *Xvalue_pointer,string *Xdefault_value)

{
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  string *in_R9;
  string local_70 [7];
  undefined1 in_stack_ffffffffffffff97;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  HighsOptionType in_stack_ffffffffffffffac;
  OptionRecord *in_stack_ffffffffffffffb0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  std::__cxx11::string::string(local_70,in_RDX);
  OptionRecord::OptionRecord
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  *in_RDI = &PTR__OptionRecordString_001b6570;
  std::__cxx11::string::string((string *)(in_RDI + 0xc));
  in_RDI[0xb] = in_R8;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xc),in_R9);
  std::__cxx11::string::operator=((string *)in_RDI[0xb],(string *)(in_RDI + 0xc));
  return;
}

Assistant:

OptionRecordString(std::string Xname, std::string Xdescription,
                     bool Xadvanced, std::string* Xvalue_pointer,
                     std::string Xdefault_value)
      : OptionRecord(HighsOptionType::kString, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    default_value = Xdefault_value;
    *value = default_value;
  }